

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O0

void alias_release(xml_alias_t *alias)

{
  int iVar1;
  xml_alias_t *alias_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
  iVar1 = is_valid_alias(alias);
  if (iVar1 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
  }
  else {
    if (*alias->ct < 1) {
      __assert_fail("*alias->ct > 0",".upnp/src/genlib/net/http/webserver.c",0x19e,
                    "void alias_release(struct xml_alias_t *)");
    }
    *alias->ct = *alias->ct + -1;
    if (*alias->ct < 1) {
      membuffer_destroy(&alias->doc);
      membuffer_destroy(&alias->name);
      free(alias->ct);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
  }
  return;
}

Assistant:

static void alias_release(
	/*! [in] XML alias object. */
	struct xml_alias_t *alias)
{
	ithread_mutex_lock(&gWebMutex);
	/* ignore invalid alias */
	if (!is_valid_alias(alias)) {
		ithread_mutex_unlock(&gWebMutex);
		return;
	}
	assert(*alias->ct > 0);
	*alias->ct -= 1;
	if (*alias->ct <= 0) {
		membuffer_destroy(&alias->doc);
		membuffer_destroy(&alias->name);
		free(alias->ct);
	}
	ithread_mutex_unlock(&gWebMutex);
}